

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_slb_describe_zones.cc
# Opt level: O3

int __thiscall
aliyun::Slb::DescribeZones
          (Slb *this,SlbDescribeZonesRequestType *req,SlbDescribeZonesResponseType *response,
          SlbErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ArrayIndex AVar5;
  char *pcVar6;
  AliRpcRequest *this_00;
  long *plVar7;
  size_t sVar8;
  Value *pVVar9;
  Value *pVVar10;
  Value *this_01;
  size_type *psVar11;
  uint index;
  uint index_00;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  Value local_480;
  undefined1 local_468 [24];
  string local_450 [8];
  size_type local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  _Alloc_hider local_430;
  size_type local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  undefined1 local_410 [32];
  _Alloc_hider local_3f0;
  size_type local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  vector<aliyun::SlbDescribeZonesZoneType,_std::allocator<aliyun::SlbDescribeZonesZoneType>_>
  *local_3d0;
  string local_3c8;
  long *local_3a8;
  long local_3a0;
  long local_398 [2];
  string local_388;
  Value *local_368;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar6 = "https";
  }
  local_3a8 = local_398;
  local_3d0 = &response->zones;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,pcVar6,pcVar6 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_468);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_3c8);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_3a8,local_3a0 + (long)local_3a8);
  std::__cxx11::string::append((char *)&local_140);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_360.field_2._M_allocated_capacity = *psVar11;
    local_360.field_2._8_8_ = plVar7[3];
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  }
  else {
    local_360.field_2._M_allocated_capacity = *psVar11;
    local_360._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_360._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar8 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar6,pcVar6 + sVar8);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_480,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"DescribeZones","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->owner_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"OwnerId","");
    pcVar2 = (req->owner_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ResourceOwnerAccount","");
    pcVar2 = (req->resource_owner_account)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + (req->resource_owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ResourceOwnerId","");
    pcVar2 = (req->resource_owner_id)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar2,pcVar2 + (req->resource_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->owner_account)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"OwnerAccount","");
    pcVar2 = (req->owner_account)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar2,pcVar2 + (req->owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_468);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_388);
    if (((0 < iVar4) && (local_388._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_388,&local_480,true), bVar3)) {
      if (error_info != (SlbErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_480,"RequestId");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_480,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_468,pVVar9);
        }
        else {
          local_468._0_8_ = local_468 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,anon_var_dwarf_27cd8e + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_468);
        pcVar2 = local_468 + 0x10;
        if ((pointer)local_468._0_8_ != pcVar2) {
          operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_480,"Code");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_480,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_468,pVVar9);
        }
        else {
          local_468._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,anon_var_dwarf_27cd8e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_468);
        if ((pointer)local_468._0_8_ != pcVar2) {
          operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_480,"HostId");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_480,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_468,pVVar9);
        }
        else {
          local_468._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,anon_var_dwarf_27cd8e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_468);
        if ((pointer)local_468._0_8_ != pcVar2) {
          operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&local_480,"Message");
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_480,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_468,pVVar9);
        }
        else {
          local_468._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_468,anon_var_dwarf_27cd8e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_468);
        if ((pointer)local_468._0_8_ != pcVar2) {
          operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
        }
      }
      if (local_3d0 !=
          (vector<aliyun::SlbDescribeZonesZoneType,_std::allocator<aliyun::SlbDescribeZonesZoneType>_>
           *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&local_480,"Zones");
        iVar4 = 200;
        if (bVar3) {
          pVVar9 = Json::Value::operator[](&local_480,"Zones");
          bVar3 = Json::Value::isMember(pVVar9,"Zone");
          if (bVar3) {
            pVVar9 = Json::Value::operator[](&local_480,"Zones");
            pVVar9 = Json::Value::operator[](pVVar9,"Zone");
            bVar3 = Json::Value::isArray(pVVar9);
            if ((bVar3) && (AVar5 = Json::Value::size(pVVar9), AVar5 != 0)) {
              index_00 = 0;
              local_368 = pVVar9;
              do {
                local_450 = (string  [8])&local_440;
                local_468._0_8_ = (pointer)0x0;
                local_468._8_8_ = (pointer)0x0;
                local_468._16_8_ = 0;
                local_448 = 0;
                local_440._M_local_buf[0] = '\0';
                local_430._M_p = (pointer)&local_420;
                local_428 = 0;
                local_420._M_local_buf[0] = '\0';
                pVVar9 = Json::Value::operator[](pVVar9,index_00);
                bVar3 = Json::Value::isMember(pVVar9,"ZoneId");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"ZoneId");
                  Json::Value::asString_abi_cxx11_((string *)local_410,pVVar10);
                  std::__cxx11::string::operator=(local_450,(string *)local_410);
                  if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
                    operator_delete((void *)local_410._0_8_,
                                    CONCAT71(local_410._17_7_,local_410[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"LocalName");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"LocalName");
                  Json::Value::asString_abi_cxx11_((string *)local_410,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_430,(string *)local_410);
                  if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
                    operator_delete((void *)local_410._0_8_,
                                    CONCAT71(local_410._17_7_,local_410[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar9,"SlaveZones");
                if (bVar3) {
                  pVVar10 = Json::Value::operator[](pVVar9,"SlaveZones");
                  bVar3 = Json::Value::isMember(pVVar10,"SlaveZone");
                  if (bVar3) {
                    pVVar9 = Json::Value::operator[](pVVar9,"SlaveZones");
                    pVVar9 = Json::Value::operator[](pVVar9,"SlaveZone");
                    bVar3 = Json::Value::isArray(pVVar9);
                    if ((bVar3) && (AVar5 = Json::Value::size(pVVar9), AVar5 != 0)) {
                      index = 0;
                      do {
                        local_410._0_8_ = local_410 + 0x10;
                        local_410._8_8_ = 0;
                        local_410[0x10] = '\0';
                        local_3f0._M_p = (pointer)&local_3e0;
                        local_3e8 = 0;
                        local_3e0._M_local_buf[0] = '\0';
                        pVVar10 = Json::Value::operator[](pVVar9,index);
                        bVar3 = Json::Value::isMember(pVVar10,"ZoneId");
                        if (bVar3) {
                          this_01 = Json::Value::operator[](pVVar10,"ZoneId");
                          Json::Value::asString_abi_cxx11_(&local_3c8,this_01);
                          std::__cxx11::string::operator=((string *)local_410,(string *)&local_3c8);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                            operator_delete(local_3c8._M_dataplus._M_p,
                                            local_3c8.field_2._M_allocated_capacity + 1);
                          }
                        }
                        bVar3 = Json::Value::isMember(pVVar10,"LocalName");
                        if (bVar3) {
                          pVVar10 = Json::Value::operator[](pVVar10,"LocalName");
                          Json::Value::asString_abi_cxx11_(&local_3c8,pVVar10);
                          std::__cxx11::string::operator=((string *)&local_3f0,(string *)&local_3c8)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                            operator_delete(local_3c8._M_dataplus._M_p,
                                            local_3c8.field_2._M_allocated_capacity + 1);
                          }
                        }
                        std::
                        vector<aliyun::SlbDescribeZonesSlaveZoneType,_std::allocator<aliyun::SlbDescribeZonesSlaveZoneType>_>
                        ::push_back((vector<aliyun::SlbDescribeZonesSlaveZoneType,_std::allocator<aliyun::SlbDescribeZonesSlaveZoneType>_>
                                     *)local_468,(value_type *)local_410);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3f0._M_p != &local_3e0) {
                          operator_delete(local_3f0._M_p,
                                          CONCAT71(local_3e0._M_allocated_capacity._1_7_,
                                                   local_3e0._M_local_buf[0]) + 1);
                        }
                        if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
                          operator_delete((void *)local_410._0_8_,
                                          CONCAT71(local_410._17_7_,local_410[0x10]) + 1);
                        }
                        AVar5 = Json::Value::size(pVVar9);
                        index = index + 1;
                      } while (index < AVar5);
                    }
                  }
                }
                std::
                vector<aliyun::SlbDescribeZonesZoneType,_std::allocator<aliyun::SlbDescribeZonesZoneType>_>
                ::push_back(local_3d0,(value_type *)local_468);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_430._M_p != &local_420) {
                  operator_delete(local_430._M_p,
                                  CONCAT71(local_420._M_allocated_capacity._1_7_,
                                           local_420._M_local_buf[0]) + 1);
                }
                pVVar9 = local_368;
                if (local_450 != (string  [8])&local_440) {
                  operator_delete((void *)local_450,
                                  CONCAT71(local_440._M_allocated_capacity._1_7_,
                                           local_440._M_local_buf[0]) + 1);
                }
                std::
                vector<aliyun::SlbDescribeZonesSlaveZoneType,_std::allocator<aliyun::SlbDescribeZonesSlaveZoneType>_>
                ::~vector((vector<aliyun::SlbDescribeZonesSlaveZoneType,_std::allocator<aliyun::SlbDescribeZonesSlaveZoneType>_>
                           *)local_468);
                AVar5 = Json::Value::size(pVVar9);
                index_00 = index_00 + 1;
              } while (index_00 < AVar5);
            }
          }
        }
      }
      goto LAB_0014b20a;
    }
    if (error_info == (SlbErrorInfo *)0x0) goto LAB_0014b205;
    pcVar6 = "parse response failed";
  }
  else {
    if (error_info == (SlbErrorInfo *)0x0) {
LAB_0014b205:
      iVar4 = -1;
      goto LAB_0014b20a;
    }
    pcVar6 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar6);
LAB_0014b20a:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_480);
  if (local_3a8 != local_398) {
    operator_delete(local_3a8,local_398[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,
                    CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                             local_388.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Slb::DescribeZones(const SlbDescribeZonesRequestType& req,
                      SlbDescribeZonesResponseType* response,
                       SlbErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeZones");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}